

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

op_t * modify_for_block_move(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t mem,op_t index)

{
  MIR_op_t op2;
  MIR_op_t op2_00;
  MIR_op_t op3;
  MIR_op_t op3_00;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2_01;
  MIR_op_t op1_01;
  undefined1 auVar1 [48];
  undefined1 auVar2 [12];
  MIR_op_t local_158;
  MIR_op_t local_128;
  MIR_op_t local_f8;
  MIR_op_t local_c8;
  op_t local_98;
  undefined1 local_58 [8];
  op_t base;
  MIR_context_t ctx;
  c2m_ctx_t c2m_ctx_local;
  
  auVar1 = (undefined1  [48])mem._0_48_;
  auVar2 = mem.mir_op.u._20_12_;
  base.mir_op.u.mem.disp = (MIR_disp_t)c2m_ctx->ctx;
  mem._0_48_ = auVar1;
  if (((mem.mir_op.u.mem.base != 0) && ((mem.mir_op._8_2_ & 0xff) == 10)) &&
     ((index.mir_op._8_2_ & 0xff) == 1)) {
    mem.mir_op.u._20_12_ = auVar2;
    if (mem.mir_op.u.mem.index == 0) {
      mem.mir_op.u.mem.index = index.mir_op.u.reg;
      mem.mir_op.u.mem.scale = '\x01';
    }
    else {
      get_new_temp(&local_98,c2m_ctx,MIR_T_I64);
      memcpy(local_58,&local_98,0x40);
      if (mem.mir_op.u.mem.scale == '\x01') {
        MIR_new_reg_op(&local_128,(MIR_context_t)base.mir_op.u.mem.disp,mem.mir_op.u.mem.index);
        op1_00._8_8_ = base.mir_op.data;
        op1_00.data = (void *)base._8_8_;
        op1_00.u.reg = base.mir_op._8_4_;
        op1_00.u.mem.alias = base.mir_op._12_4_;
        op1_00.u._8_8_ = base.mir_op.u.i;
        op1_00.u._16_8_ = base.mir_op.u.str.s;
        op1_00.u.mem.disp = base.mir_op.u._16_8_;
        op2_00._8_8_ = local_128._8_8_;
        op2_00.data = local_128.data;
        op2_00.u.i = local_128.u.i;
        op2_00.u.str.s = local_128.u.str.s;
        op2_00.u._16_8_ = local_128.u._16_8_;
        op2_00.u.mem.disp = local_128.u.mem.disp;
        emit2(c2m_ctx,MIR_MOV,op1_00,op2_00);
      }
      else {
        MIR_new_reg_op(&local_c8,(MIR_context_t)base.mir_op.u.mem.disp,mem.mir_op.u.mem.index);
        MIR_new_int_op(&local_f8,(MIR_context_t)base.mir_op.u.mem.disp,(ulong)mem.mir_op.u.mem.scale
                      );
        op1._8_8_ = base.mir_op.data;
        op1.data = (void *)base._8_8_;
        op1.u.reg = base.mir_op._8_4_;
        op1.u.mem.alias = base.mir_op._12_4_;
        op1.u._8_8_ = base.mir_op.u.i;
        op1.u._16_8_ = base.mir_op.u.str.s;
        op1.u.mem.disp = base.mir_op.u._16_8_;
        op2._8_8_ = local_c8._8_8_;
        op2.data = local_c8.data;
        op2.u.i = local_c8.u.i;
        op2.u.str.s = local_c8.u.str.s;
        op2.u._16_8_ = local_c8.u._16_8_;
        op2.u.mem.disp = local_c8.u.mem.disp;
        op3._8_8_ = local_f8._8_8_;
        op3.data = local_f8.data;
        op3.u.i = local_f8.u.i;
        op3.u.str.s = local_f8.u.str.s;
        op3.u._16_8_ = local_f8.u._16_8_;
        op3.u.mem.disp = local_f8.u.mem.disp;
        emit3(c2m_ctx,MIR_MUL,op1,op2,op3);
      }
      MIR_new_reg_op(&local_158,(MIR_context_t)base.mir_op.u.mem.disp,mem.mir_op.u.mem.base);
      op2_01._8_8_ = base.mir_op.data;
      op2_01.data = (void *)base._8_8_;
      op2_01.u.reg = base.mir_op._8_4_;
      op2_01.u.mem.alias = base.mir_op._12_4_;
      op2_01.u._8_8_ = base.mir_op.u.i;
      op2_01.u._16_8_ = base.mir_op.u.str.s;
      op2_01.u.mem.disp = base.mir_op.u._16_8_;
      op1_01._8_8_ = base.mir_op.data;
      op1_01.data = (void *)base._8_8_;
      op1_01.u.reg = base.mir_op._8_4_;
      op1_01.u.mem.alias = base.mir_op._12_4_;
      op1_01.u._8_8_ = base.mir_op.u.i;
      op1_01.u._16_8_ = base.mir_op.u.str.s;
      op1_01.u.mem.disp = base.mir_op.u._16_8_;
      op3_00._8_8_ = local_158._8_8_;
      op3_00.data = local_158.data;
      op3_00.u.i = local_158.u.i;
      op3_00.u.str.s = local_158.u.str.s;
      op3_00.u._16_8_ = local_158.u._16_8_;
      op3_00.u.mem.disp = local_158.u.mem.disp;
      emit3(c2m_ctx,MIR_ADD,op1_01,op2_01,op3_00);
      mem.mir_op.u.mem.base = base.mir_op._8_4_;
      mem.mir_op.u.mem.index = index.mir_op.u.reg;
    }
    memcpy(__return_storage_ptr__,&mem,0x40);
    return __return_storage_ptr__;
  }
  __assert_fail("mem.mir_op.u.mem.base != 0 && mem.mir_op.mode == MIR_OP_MEM && index.mir_op.mode == MIR_OP_REG"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2b07,"op_t modify_for_block_move(c2m_ctx_t, op_t, op_t)");
}

Assistant:

static op_t modify_for_block_move (c2m_ctx_t c2m_ctx, op_t mem, op_t index) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t base;

  assert (mem.mir_op.u.mem.base != 0 && mem.mir_op.mode == MIR_OP_MEM
          && index.mir_op.mode == MIR_OP_REG);
  if (mem.mir_op.u.mem.index == 0) {
    mem.mir_op.u.mem.index = index.mir_op.u.reg;
    mem.mir_op.u.mem.scale = 1;
  } else {
    base = get_new_temp (c2m_ctx, MIR_T_I64);
    if (mem.mir_op.u.mem.scale != 1)
      emit3 (c2m_ctx, MIR_MUL, base.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index),
             MIR_new_int_op (ctx, mem.mir_op.u.mem.scale));
    else
      emit2 (c2m_ctx, MIR_MOV, base.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index));
    emit3 (c2m_ctx, MIR_ADD, base.mir_op, base.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.base));
    mem.mir_op.u.mem.base = base.mir_op.u.reg;
    mem.mir_op.u.mem.index = index.mir_op.u.reg;
    mem.mir_op.u.mem.scale = 1;
  }
  mem.mir_op.u.mem.alias = mem.mir_op.u.mem.nonalias = 0;
  return mem;
}